

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_harbor.c
# Opt level: O1

void harbor_command(harbor *h,char *msg,size_t sz,int session,uint32_t source)

{
  char *__src;
  uint32_t *puVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  hashmap *hash;
  harbor_msg_queue *phVar5;
  long lVar6;
  keyvalue *pkVar7;
  long lVar8;
  undefined1 *buffer;
  ulong uVar9;
  int iVar10;
  harbor_msg *phVar11;
  char *msg_00;
  skynet_context *psVar12;
  undefined4 in_register_00000084;
  ulong __n;
  uint uVar13;
  uint uVar14;
  void *__dest;
  undefined8 uStack_80;
  uint uStack_78;
  undefined4 uStack_74;
  int id;
  undefined4 uStack_6c;
  undefined1 local_68;
  slave *local_60;
  undefined8 uStack_58;
  remote_name rn;
  
  __src = msg + 2;
  iVar10 = (int)sz;
  __n = (long)iVar10 - 2;
  bVar2 = *msg;
  uVar9 = (ulong)bVar2;
  if ((bVar2 == 0x41) || (bVar2 == 0x53)) {
    lVar6 = -((ulong)(iVar10 - 1) + 0xf & 0xfffffffffffffff0);
    __dest = (void *)((long)&uStack_78 + lVar6);
    *(undefined8 *)((long)&uStack_80 + lVar6) = 0x10de08;
    memcpy(__dest,__src,__n);
    *(undefined1 *)(__n + (long)__dest) = 0;
    uStack_58 = (ulong)uStack_58._4_4_ << 0x20;
    uStack_78 = 0;
    *(undefined8 *)((long)&uStack_80 + lVar6) = 0x10de36;
    __isoc99_sscanf(__dest,"%d %d",&uStack_58,&uStack_78);
    iVar10 = (uint)uStack_58;
    if (uStack_78 - 0x100 < 0xffffff01 || (uint)uStack_58 == 0) {
      psVar12 = h->ctx;
      cVar3 = *msg;
      *(undefined8 *)((long)&uStack_80 + lVar6) = 0x10de71;
      skynet_error(psVar12,"Invalid command %c %s",(ulong)(uint)(int)cVar3,__dest);
    }
    else {
      uVar9 = (ulong)uStack_78;
      if (h->s[uVar9].fd == 0) {
        local_60 = h->s;
        h->s[uVar9].fd = (uint)uStack_58;
        psVar12 = h->ctx;
        *(undefined8 *)((long)&uStack_80 + lVar6) = 0x10dffc;
        skynet_socket_start(psVar12,iVar10);
        lVar8 = (long)(int)uStack_78;
        *(undefined8 *)((long)&uStack_80 + lVar6) = 0x10e00e;
        buffer = (undefined1 *)malloc(1);
        *buffer = (char)h->id;
        psVar12 = h->ctx;
        iVar10 = local_60[lVar8].fd;
        *(undefined8 *)((long)&uStack_80 + lVar6) = 0x10e02b;
        skynet_socket_send(psVar12,iVar10,buffer,1);
        uVar13 = uStack_78;
        if (*msg == 'S') {
          h->s[uVar9].status = 1;
        }
        else {
          h->s[uVar9].status = 2;
          *(undefined8 *)((long)&uStack_80 + lVar6) = 0x10e04e;
          dispatch_queue(h,uVar13);
        }
      }
      else {
        psVar12 = h->ctx;
        *(undefined8 *)((long)&uStack_80 + lVar6) = 0x10dea0;
        skynet_error(psVar12,"Harbor %d alreay exist");
      }
    }
    return;
  }
  if (bVar2 == 0x4e) {
    uVar9 = (ulong)(iVar10 - 0x12U);
    if (0xfffffff0 < iVar10 - 0x12U) {
      uStack_58 = 0;
      rn.name[0] = '\0';
      rn.name[1] = '\0';
      rn.name[2] = '\0';
      rn.name[3] = '\0';
      rn.name[4] = '\0';
      rn.name[5] = '\0';
      rn.name[6] = '\0';
      rn.name[7] = '\0';
      rn.name[8] = '\0';
      rn.name[9] = '\0';
      rn.name[10] = '\0';
      rn.name[0xb] = '\0';
      uStack_80 = (code *)0x10dee8;
      memcpy(&uStack_58,__src,__n & 0xffffffff);
      hash = h->map;
      uStack_80 = (code *)0x10defb;
      rn.name._8_4_ = session;
      pkVar7 = hash_search(hash,(char *)&uStack_58);
      if (pkVar7 == (keyvalue *)0x0) {
        uVar14 = uStack_58._4_4_ ^ (uint)uStack_58 ^ rn.name._0_4_ ^ rn.name._4_4_;
        uVar13 = uVar14 & 0xfff;
        uStack_80 = (code *)0x10df24;
        pkVar7 = (keyvalue *)malloc(0x28);
        *(long *)pkVar7->key = uStack_58;
        *(undefined8 *)(pkVar7->key + 8) = rn.name._0_8_;
        pkVar7->next = hash->node[uVar13];
        pkVar7->queue = (harbor_msg_queue *)0x0;
        pkVar7->hash = uVar14;
        pkVar7->value = 0;
        hash->node[uVar13] = pkVar7;
      }
      pkVar7->value = session;
      phVar5 = pkVar7->queue;
      if (phVar5 == (harbor_msg_queue *)0x0) {
        return;
      }
      if (0xffffff < (uint)session) {
        uVar13 = (uint)session >> 0x18;
        psVar12 = h->ctx;
        iVar10 = h->s[uVar13].fd;
        if (iVar10 == 0) {
          if (h->s[uVar13].status == 4) {
            uStack_78 = *(uint *)pkVar7->key;
            uStack_74 = *(undefined4 *)(pkVar7->key + 4);
            id = *(int *)(pkVar7->key + 8);
            uStack_6c = *(undefined4 *)(pkVar7->key + 0xc);
            local_68 = 0;
            uStack_80 = (code *)0x10e084;
            skynet_error(psVar12,"Drop message to %s (in harbor %d)");
          }
          else if (h->s[uVar13].queue == (harbor_msg_queue *)0x0) {
            h->s[uVar13].queue = phVar5;
            pkVar7->queue = (harbor_msg_queue *)0x0;
          }
          else {
            while( true ) {
              iVar10 = phVar5->head;
              if (iVar10 == phVar5->tail) {
                phVar11 = (harbor_msg *)0x0;
              }
              else {
                phVar11 = phVar5->data + iVar10;
                phVar5->head = (iVar10 + 1) % phVar5->size;
              }
              if (phVar11 == (harbor_msg *)0x0) break;
              uStack_80 = (code *)0x10e0a4;
              push_queue_msg(h->s[uVar13].queue,phVar11);
            }
          }
        }
        else {
          while( true ) {
            iVar4 = phVar5->head;
            if (iVar4 == phVar5->tail) {
              phVar11 = (harbor_msg *)0x0;
            }
            else {
              phVar11 = phVar5->data + iVar4;
              phVar5->head = (iVar4 + 1) % phVar5->size;
            }
            if (phVar11 == (harbor_msg *)0x0) break;
            puVar1 = &(phVar11->header).destination;
            *puVar1 = *puVar1 | session & 0xffffffU;
            uStack_80 = (code *)0x10dfd6;
            send_remote(psVar12,iVar10,(char *)phVar11->buffer,phVar11->size,&phVar11->header);
            uStack_80 = (code *)0x10dfdf;
            free(phVar11->buffer);
          }
        }
        uStack_80 = (code *)0x10e0d9;
        release_queue(pkVar7->queue);
        pkVar7->queue = (harbor_msg_queue *)0x0;
        return;
      }
      uStack_80 = remote_send_handle;
      __assert_fail("harbor_id != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/service-src/service_harbor.c"
                    ,0x15d,"void dispatch_name_queue(struct harbor *, struct keyvalue *)");
    }
    psVar12 = h->ctx;
    msg_00 = "Invalid global name %s";
    msg = __src;
  }
  else {
    psVar12 = h->ctx;
    msg_00 = "Unknown command %s";
  }
  skynet_error(psVar12,msg_00,msg,uVar9,CONCAT44(in_register_00000084,source));
  return;
}

Assistant:

static void
harbor_command(struct harbor * h, const char * msg, size_t sz, int session, uint32_t source) {
	const char * name = msg + 2;
	int s = (int)sz;
	s -= 2;
	switch(msg[0]) {
	case 'N' : {
		if (s <=0 || s>= GLOBALNAME_LENGTH) {
			skynet_error(h->ctx, "Invalid global name %s", name);
			return;
		}
		struct remote_name rn;
		memset(&rn, 0, sizeof(rn));
		memcpy(rn.name, name, s);
		rn.handle = source;
		update_name(h, rn.name, rn.handle);
		break;
	}
	case 'S' :
	case 'A' : {
		char buffer[s+1];
		memcpy(buffer, name, s);
		buffer[s] = 0;
		int fd=0, id=0;
		sscanf(buffer, "%d %d",&fd,&id);
		if (fd == 0 || id <= 0 || id>=REMOTE_MAX) {
			skynet_error(h->ctx, "Invalid command %c %s", msg[0], buffer);
			return;
		}
		struct slave * slave = &h->s[id];
		if (slave->fd != 0) {
			skynet_error(h->ctx, "Harbor %d alreay exist", id);
			return;
		}
		slave->fd = fd;

		skynet_socket_start(h->ctx, fd);
		handshake(h, id);
		if (msg[0] == 'S') {
			slave->status = STATUS_HANDSHAKE;
		} else {
			slave->status = STATUS_HEADER;
			dispatch_queue(h,id);
		}
		break;
	}
	default:
		skynet_error(h->ctx, "Unknown command %s", msg);
		return;
	}
}